

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O2

void __thiscall ECC_Context::ECC_Context(ECC_Context *this)

{
  long lVar1;
  int iVar2;
  secp256k1_context *ctx;
  long in_FS_OFFSET;
  Span<unsigned_char> bytes;
  allocator_type local_31;
  vector<unsigned_char,_secure_allocator<unsigned_char>_> vseed;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (secp256k1_context_sign != (secp256k1_context *)0x0) {
    __assert_fail("secp256k1_context_sign == nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                  ,0x1c2,"void ECC_Start()");
  }
  ctx = secp256k1_context_create(1);
  if (ctx == (secp256k1_context *)0x0) {
    __assert_fail("ctx != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                  ,0x1c5,"void ECC_Start()");
  }
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::vector(&vseed,0x20,&local_31);
  bytes.m_size = (long)vseed.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)vseed.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
  bytes.m_data = vseed.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  GetRandBytes(bytes);
  iVar2 = secp256k1_context_randomize
                    (ctx,vseed.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start);
  if (iVar2 == 0) {
    __assert_fail("ret",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                  ,0x1cc,"void ECC_Start()");
  }
  std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base
            (&vseed.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>);
  secp256k1_context_sign = ctx;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ECC_Context::ECC_Context()
{
    ECC_Start();
}